

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

LONG __thiscall
CorUnix::CSynchData::ReleaseAllLocalWaiters(CSynchData *this,CPalThread *pthrCurrent)

{
  DWORD dwObjectIndex;
  ThreadWaitInfo *ptwiWaitInfo_00;
  bool bVar1;
  DWORD DVar2;
  bool bVar3;
  ObjectDomain OVar4;
  WaitCompletionState WVar5;
  OwnershipSemantics OVar6;
  PAL_ERROR PVar7;
  CPalSynchronizationManager *this_00;
  SHMPTR shmptr;
  _WaitingThreadsListNode *p_Var8;
  DWORD *pWaitState;
  CObjectType *this_01;
  ThreadWakeupReason twrWakeupReason;
  bool bVar9;
  bool bVar10;
  bool local_79;
  bool fAbandoned;
  ThreadWaitInfo *ptwiWaitInfo;
  bool fWaitAll;
  CPalSynchronizationManager *pSynchManager;
  DWORD dwPid;
  WaitingThreadsListNode *pwtlnNextItem;
  WaitingThreadsListNode *pwtlnItem;
  SHMPTR shridNextItem;
  SHMPTR shridItem;
  DWORD dwObjIdx;
  DWORD *pdwWaitState;
  int local_20;
  bool fSharedObject;
  bool fSharedSynchLock;
  LONG lAwakenedCount;
  PAL_ERROR palErr;
  CPalThread *pthrCurrent_local;
  CSynchData *this_local;
  
  local_20 = 0;
  bVar1 = false;
  OVar4 = GetObjectDomain(this);
  DVar2 = gPID;
  bVar9 = OVar4 != SharedObject;
  this_00 = CPalSynchronizationManager::GetInstance();
  if (bVar9) {
    p_Var8 = GetWTLHeadPtr(this);
  }
  else {
    shmptr = GetWTLHeadShmPtr(this);
    p_Var8 = (_WaitingThreadsListNode *)SHMPtrToPtr(shmptr);
  }
  while( true ) {
    do {
      do {
        pwtlnNextItem = p_Var8;
        if (pwtlnNextItem == (WaitingThreadsListNode *)0x0) {
          if (bVar1 != false) {
            CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
          }
          return local_20;
        }
        bVar10 = (pwtlnNextItem->dwFlags & 2) != 0;
        pWaitState = (DWORD *)SHMPtrToPtr(pwtlnNextItem->shridWaitingState);
        if (bVar9) {
          p_Var8 = (pwtlnNextItem->ptrNext).ptr;
          if (pwtlnNextItem->dwProcessId != gPID) {
            fprintf(_stderr,"] %s %s:%d","ReleaseAllLocalWaiters",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                    ,0x59a);
            fprintf(_stderr,"Expression: fSharedObject || pwtlnItem->dwProcessId == gPID\n");
          }
        }
        else {
          p_Var8 = (_WaitingThreadsListNode *)SHMPtrToPtr((pwtlnNextItem->ptrNext).shrid);
        }
        if (((!bVar1) && (bVar9)) && (pwtlnNextItem->ptwiWaitInfo->wdWaitDomain != LocalWait)) {
          CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
          bVar1 = true;
        }
      } while ((DVar2 != pwtlnNextItem->dwProcessId) ||
              ((bVar10 &&
               (WVar5 = IsRestOfWaitAllSatisfied(this,pwtlnNextItem), WVar5 != WaitIsSatisfied))));
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      bVar3 = CPalSynchronizationManager::InterlockedAwaken(pWaitState,false);
    } while (!bVar3);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    dwObjectIndex = pwtlnNextItem->dwObjIndex;
    ptwiWaitInfo_00 = pwtlnNextItem->ptwiWaitInfo;
    local_79 = false;
    this_01 = GetObjectType(this);
    OVar6 = CObjectType::GetOwnershipSemantics(this_01);
    if (OVar6 == OwnershipTracked) {
      local_79 = IsAbandoned(this);
      PVar7 = AssignOwnershipToThread(this,pthrCurrent,ptwiWaitInfo_00->pthrOwner);
      if ((PVar7 != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
        abort();
      }
    }
    if (bVar10) {
      CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll
                (pthrCurrent,ptwiWaitInfo_00->pthrOwner,pwtlnNextItem,this);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) break;
    bVar10 = true;
    if (bVar9) {
      bVar10 = bVar1;
    }
    CPalSynchronizationManager::UnRegisterWait(this_00,pthrCurrent,ptwiWaitInfo_00,bVar10);
    twrWakeupReason = WaitSucceeded;
    if (local_79 != false) {
      twrWakeupReason = MutexAbondoned;
    }
    PVar7 = CPalSynchronizationManager::WakeUpLocalThread
                      (pthrCurrent,ptwiWaitInfo_00->pthrOwner,twrWakeupReason,dwObjectIndex);
    if (PVar7 == 0) {
      local_20 = local_20 + 1;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CPalThread::GetThreadId(ptwiWaitInfo_00->pthrOwner);
    }
  }
  abort();
}

Assistant:

LONG CSynchData::ReleaseAllLocalWaiters(
        CPalThread * pthrCurrent)
    {        
        PAL_ERROR palErr = NO_ERROR;
        LONG lAwakenedCount = 0;
        bool fSharedSynchLock = false;
        bool fSharedObject = (SharedObject == GetObjectDomain());
        DWORD * pdwWaitState;
        DWORD dwObjIdx;
        SharedID shridItem = NULLSharedID, shridNextItem = NULLSharedID;
        WaitingThreadsListNode * pwtlnItem, * pwtlnNextItem;
        DWORD dwPid = gPID;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        VALIDATEOBJECT(this);

        if (fSharedObject)
        {
            shridItem = GetWTLHeadShmPtr();
            pwtlnItem = SharedIDToTypePointer(WaitingThreadsListNode, shridItem);
        }
        else
        {
            pwtlnItem = GetWTLHeadPtr();
        }
            
        while (pwtlnItem)
        {
            VALIDATEOBJECT(pwtlnItem);
            
            bool fWaitAll = (0 != (WTLN_FLAG_WAIT_ALL & pwtlnItem->dwFlags));
            pdwWaitState = SharedIDToTypePointer(DWORD, 
                pwtlnItem->shridWaitingState);           

            if (fSharedObject)
            {
                shridNextItem = pwtlnItem->ptrNext.shrid;
                pwtlnNextItem = SharedIDToTypePointer(WaitingThreadsListNode, 
                                                  shridNextItem);
            }
            else
            {
                pwtlnNextItem = pwtlnItem->ptrNext.ptr;
            }    

            // See note in similar spot in ReleaseFirstWaiter
            
            _ASSERTE(fSharedObject || pwtlnItem->dwProcessId == gPID); 

            if (!fSharedSynchLock && !fSharedObject && 
                LocalWait != pwtlnItem->ptwiWaitInfo->wdWaitDomain)
            {
                CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
                fSharedSynchLock = true;
            }   

            if( dwPid == pwtlnItem->dwProcessId &&
                (!fWaitAll || WaitIsSatisfied == IsRestOfWaitAllSatisfied(pwtlnItem)) )
            {
                //
                // Target wait is satisfied
                //
                TRACE("Trying to switch wait state [%p] from WAIT/ALERTABLE "
                      "to ACTIVE for thread=%u\n", 
                      pdwWaitState, pwtlnItem->dwThreadId);
                
                if (CPalSynchronizationManager::InterlockedAwaken(pdwWaitState, FALSE))
                {
                    TRACE("Succeeded switching wait state [%p] from WAIT/ALERTABLE "
                          "to TWS_ACTIVE for trhead=%u\n", 
                          pdwWaitState, pwtlnItem->dwThreadId);

                    dwObjIdx = pwtlnItem->dwObjIndex;
                    
                    ThreadWaitInfo * ptwiWaitInfo = pwtlnItem->ptwiWaitInfo;
                    bool fAbandoned = false;

                    if (CObjectType::OwnershipTracked ==
                        GetObjectType()->GetOwnershipSemantics())
                    {
                        // Get the abandoned status before resetting it by
                        // assigning ownership to target thread
                        fAbandoned = IsAbandoned();
                        
                        // Assign ownership to target thread
                        palErr = AssignOwnershipToThread(pthrCurrent,
                                                         ptwiWaitInfo->pthrOwner);
                        if (NO_ERROR != palErr)
                        {
                            ERROR("Synch Worker: AssignOwnershipToThread "
                                  "failed with error %u; ownership data on "
                                  "object with SynchData %p may be "
                                  "corrupted\n", palErr, this);
                        }
                    }

                    if (fWaitAll)
                    {
                        // Wait all satisfied: unsignal other objects 
                        // involved in the wait
                        CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll(
                                                   pthrCurrent,
                                                   ptwiWaitInfo->pthrOwner,
                                                   pwtlnItem,
                                                   this);
                    }                        

                    TRACE("Unregistering wait for thread %u and waking it up "
                          "[pdwWaitState=%p]\n", pwtlnItem->dwThreadId, 
                          pdwWaitState);
                    
                    // Unregister the wait
                    pSynchManager->UnRegisterWait(pthrCurrent, 
                                                  ptwiWaitInfo, 
                                                  fSharedObject || fSharedSynchLock);

                    // After UnRegisterWait pwtlnItem is invalid
                    pwtlnItem = NULL; 
                                            
                    palErr = CPalSynchronizationManager::WakeUpLocalThread(
                        pthrCurrent, 
                        ptwiWaitInfo->pthrOwner, 
                        fAbandoned ? MutexAbondoned : WaitSucceeded,
                        dwObjIdx);
                    
                    if (NO_ERROR != palErr)
                    {
                        ERROR("Failed to wakeup local thread %#x: "
                              "object signaling may be "
                              "lost\n", ptwiWaitInfo->pthrOwner->GetThreadId());
                    }
                    else
                    {
                        // A thread has been awakened
                        lAwakenedCount++;
                    }
                }
            }

            // Go to the next item
            shridItem = shridNextItem;
            pwtlnItem = pwtlnNextItem;
        }

        if (fSharedSynchLock)
        {
            CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
        }        
        return lAwakenedCount;
    }